

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O3

int ImPlot::LabelAxisValue
              (ImPlotAxis *axis,ImPlotTickCollection *ticks,double value,char *buff,int size)

{
  undefined1 uVar1;
  undefined1 uVar2;
  ImPlotPlot *pIVar3;
  ImPlotContext *pIVar4;
  int i;
  int iVar5;
  ImPlotTick *pIVar6;
  double *pdVar7;
  ulong uVar8;
  ImPlotTick *pIVar9;
  undefined4 in_R9D;
  ulong uVar10;
  double dVar11;
  ImPlotDateTimeFmt fmt;
  long local_38;
  int local_30;
  
  pIVar4 = GImPlot;
  if ((axis->Flags & 0x40) == 0) {
    if (ticks->Size < 2) {
      pIVar6 = (ImPlotTick *)&axis->Range;
      pIVar9 = (ImPlotTick *)&(axis->Range).Max;
    }
    else {
      if ((ticks->Ticks).Size < 2) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                      ,0x68c,"const T &ImVector<ImPlotTick>::operator[](int) const [T = ImPlotTick]"
                     );
      }
      pIVar6 = (ticks->Ticks).Data;
      pIVar9 = pIVar6 + 1;
    }
    dVar11 = pIVar9->PlotPos - pIVar6->PlotPos;
    uVar8 = 1;
    if ((dVar11 != 0.0) || (NAN(dVar11))) {
      dVar11 = log10(ABS(dVar11));
      dVar11 = floor(dVar11);
      uVar8 = 0;
      if ((int)dVar11 < 1) {
        uVar8 = (ulong)(1 - (int)dVar11);
      }
    }
    iVar5 = snprintf(buff,(long)size,"%.*f",value,uVar8);
    return iVar5;
  }
  dVar11 = (axis->Range).Max - (axis->Range).Min;
  pIVar3 = GImPlot->CurrentPlot;
  if (axis->Orientation == 0) {
    pdVar7 = (double *)&GetUnitForRange(double)::cutoffs;
    uVar8 = 0;
    do {
      if (dVar11 / (double)(((pIVar3->PlotRect).Max.x - (pIVar3->PlotRect).Min.x) / 100.0) <=
          *pdVar7) goto LAB_001ad0ef;
      uVar8 = uVar8 + 1;
      pdVar7 = pdVar7 + 1;
    } while (uVar8 != 8);
  }
  else {
    pdVar7 = (double *)&GetUnitForRange(double)::cutoffs;
    uVar8 = 0;
    do {
      if (dVar11 / (double)(((pIVar3->PlotRect).Max.y - (pIVar3->PlotRect).Min.y) / 100.0) <=
          *pdVar7) goto LAB_001ad0ef;
      uVar8 = uVar8 + 1;
      pdVar7 = pdVar7 + 1;
    } while (uVar8 != 8);
  }
  uVar8 = 8;
LAB_001ad0ef:
  uVar10 = 7;
  if ((uint)uVar8 < 7) {
    uVar10 = uVar8 & 0xffffffff;
  }
  dVar11 = floor(value);
  local_30 = (int)(value * 1000000.0 + dVar11 * -1000000.0);
  local_38 = (long)value + (long)(local_30 / 1000000);
  local_30 = local_30 % 1000000;
  uVar1 = (pIVar4->Style).UseISO8601;
  uVar2 = (pIVar4->Style).Use24HourClock;
  fmt.Date._1_1_ = uVar2;
  fmt.Date._0_1_ = uVar1;
  fmt._2_6_ = 0;
  fmt.UseISO8601 = (bool)(char)in_R9D;
  fmt.Use24HourClock = (bool)(char)((uint)in_R9D >> 8);
  fmt._10_2_ = (short)((uint)in_R9D >> 0x10);
  iVar5 = FormatDateTime((ImPlot *)&local_38,(ImPlotTime *)buff,(char *)(ulong)(uint)size,
                         (int)*(undefined8 *)((long)&TimeFormatMouseCursor + uVar10 * 0xc),fmt);
  return iVar5;
}

Assistant:

int LabelAxisValue(const ImPlotAxis& axis, const ImPlotTickCollection& ticks, double value, char* buff, int size) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(axis.Flags, ImPlotAxisFlags_Time)) {
        ImPlotTimeUnit unit = (axis.Orientation == ImPlotOrientation_Horizontal)
                            ? GetUnitForRange(axis.Range.Size() / (gp.CurrentPlot->PlotRect.GetWidth() / 100))
                            : GetUnitForRange(axis.Range.Size() / (gp.CurrentPlot->PlotRect.GetHeight() / 100));
        return FormatDateTime(ImPlotTime::FromDouble(value), buff, size, GetDateTimeFmt(TimeFormatMouseCursor, unit));
    }
    else {
        double range = ticks.Size > 1 ? (ticks.Ticks[1].PlotPos - ticks.Ticks[0].PlotPos) : axis.Range.Size();
        return snprintf(buff, size, "%.*f", Precision(range), value);
    }
}